

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Precompute.cpp
# Opt level: O0

bool __thiscall wasm::Precompute::canEmitConstantFor(Precompute *this,Type type)

{
  bool bVar1;
  Precompute *this_local;
  Type type_local;
  
  this_local = (Precompute *)type.id;
  bVar1 = wasm::Type::isFunction((Type *)&this_local);
  if (bVar1) {
    type_local.id._7_1_ = true;
  }
  else {
    bVar1 = wasm::Type::isString((Type *)&this_local);
    if (bVar1) {
      type_local.id._7_1_ = true;
    }
    else {
      bVar1 = wasm::Type::isRef((Type *)&this_local);
      if (bVar1) {
        type_local.id._7_1_ = false;
      }
      else {
        type_local.id._7_1_ = true;
      }
    }
  }
  return type_local.id._7_1_;
}

Assistant:

bool canEmitConstantFor(Type type) {
    // A function is fine to emit a constant for - we'll emit a RefFunc, which
    // is compact and immutable, so there can't be a problem.
    if (type.isFunction()) {
      return true;
    }
    // We can emit a StringConst for a string constant.
    if (type.isString()) {
      return true;
    }
    // All other reference types cannot be precomputed. Even an immutable GC
    // reference is not currently something this pass can handle, as it will
    // evaluate and reevaluate code multiple times in e.g. propagateLocals, see
    // the comment above.
    if (type.isRef()) {
      return false;
    }

    return true;
  }